

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupColVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  uint *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  pointer pnVar7;
  iterator __position;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  fpclass_type *pfVar17;
  int iVar18;
  int *piVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_b4;
  cpp_dec_float<50U,_int,_void> local_a8;
  uint *local_68;
  cpp_dec_float<50U,_int,_void> *local_60;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = &(this->u).col.val;
  pnVar7 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar7 != (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->u).col.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar7;
  }
  local_b4 = this->thedim;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)(this->u).col.size);
  __position._M_current =
       (this->u).col.val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (this->u).col.size;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_a8,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::_M_fill_insert(this_00,__position,(long)iVar3,(value_type *)&local_a8);
  if (0 < this->thedim) {
    piVar19 = (this->u).col.len;
    lVar15 = 0;
    do {
      piVar19[lVar15] = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->thedim);
  }
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
  *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_a8.data._M_elems._0_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_a8.data._M_elems._8_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_a8.data._M_elems._16_8_;
  *(ulong *)((this->maxabs).m_backend.data._M_elems + 6) =
       CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
  *(ulong *)((this->maxabs).m_backend.data._M_elems + 8) =
       CONCAT44(local_a8.data._M_elems[9],local_a8.data._M_elems[8]);
  (this->maxabs).m_backend.exp = local_a8.exp;
  (this->maxabs).m_backend.neg = local_a8.neg;
  (this->maxabs).m_backend.fpclass = local_a8.fpclass;
  (this->maxabs).m_backend.prec_elem = local_a8.prec_elem;
  if (0 < this->thedim) {
    local_60 = &(this->maxabs).m_backend;
    local_68 = (this->maxabs).m_backend.data._M_elems + 1;
    lVar15 = 0;
    do {
      iVar3 = (this->u).row.len[lVar15];
      if (0 < iVar3) {
        iVar14 = (this->u).row.start[lVar15];
        piVar19 = (this->u).row.idx + iVar14;
        iVar18 = iVar3 + 1;
        pfVar17 = &(this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar14].m_backend.fpclass;
        do {
          iVar14 = *piVar19;
          piVar8 = (this->u).col.len;
          iVar4 = piVar8[iVar14];
          lVar16 = (long)(this->u).col.start[iVar14] + (long)iVar4;
          piVar8[iVar14] = iVar4 + 1;
          (this->u).col.idx[lVar16] = (int)lVar15;
          pnVar7 = (this->u).col.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)pnVar7[lVar16].m_backend.data._M_elems + 0x20) =
               *(undefined8 *)(pfVar17 + -4);
          uVar2 = *(undefined8 *)
                   (((cpp_dec_float<50U,_int,_void> *)(pfVar17 + -0xc))->data)._M_elems;
          uVar9 = *(undefined8 *)(pfVar17 + -10);
          uVar10 = *(undefined8 *)(pfVar17 + -6);
          puVar1 = (uint *)((long)pnVar7[lVar16].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = *(undefined8 *)(pfVar17 + -8);
          *(undefined8 *)(puVar1 + 2) = uVar10;
          *(undefined8 *)pnVar7[lVar16].m_backend.data._M_elems = uVar2;
          *(undefined8 *)((long)pnVar7[lVar16].m_backend.data._M_elems + 8) = uVar9;
          pnVar7[lVar16].m_backend.exp = pfVar17[-2];
          pnVar7[lVar16].m_backend.neg = *(bool *)(pfVar17 + -1);
          *(undefined8 *)&pnVar7[lVar16].m_backend.fpclass = *(undefined8 *)pfVar17;
          local_a8.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar17 + -0xc))->data)._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)(pfVar17 + -10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)(pfVar17 + -8);
          uStack_40 = *(undefined8 *)(pfVar17 + -6);
          local_38 = *(undefined8 *)(pfVar17 + -4);
          local_a8.exp = pfVar17[-2];
          local_a8.neg = *(bool *)(pfVar17 + -1);
          local_a8.data._M_elems[8] = (uint)local_38;
          local_a8.data._M_elems[9] = (uint)((ulong)local_38 >> 0x20);
          local_a8.data._M_elems._24_5_ = SUB85(uStack_40,0);
          local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
          local_a8._48_8_ = *(undefined8 *)pfVar17;
          if ((local_a8.neg == true) &&
             (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite)) {
            local_a8.neg = false;
          }
          if ((local_a8.fpclass != cpp_dec_float_NaN) &&
             ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
            local_58 = (uint  [2])local_a8.data._M_elems._0_8_;
            auStack_50 = (uint  [2])local_a8.data._M_elems._8_8_;
            local_48 = (uint  [2])local_a8.data._M_elems._16_8_;
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_a8,local_60);
            if (0 < iVar14) {
              uVar5 = (((cpp_dec_float<50U,_int,_void> *)(pfVar17 + -0xc))->data)._M_elems[0];
              uVar6 = pfVar17[-3];
              uVar9 = *(undefined8 *)(pfVar17 + -7);
              uVar10 = *(undefined8 *)(pfVar17 + -5);
              uVar11 = *(undefined8 *)(pfVar17 + -0xb);
              uVar12 = *(undefined8 *)(pfVar17 + -9);
              bVar13 = *(bool *)(pfVar17 + -1);
              uVar2 = *(undefined8 *)pfVar17;
              if (bVar13 == true) {
                bVar13 = (int)uVar2 == 0 && uVar5 == 0;
              }
              iVar14 = pfVar17[-2];
              (this->maxabs).m_backend.data._M_elems[0] = uVar5;
              local_68[8] = uVar6;
              *(undefined8 *)(local_68 + 4) = uVar9;
              *(undefined8 *)(local_68 + 6) = uVar10;
              *(undefined8 *)local_68 = uVar11;
              *(undefined8 *)(local_68 + 2) = uVar12;
              (this->maxabs).m_backend.exp = iVar14;
              (this->maxabs).m_backend.neg = bVar13;
              (this->maxabs).m_backend.fpclass = (int)uVar2;
              (this->maxabs).m_backend.prec_elem = (int)((ulong)uVar2 >> 0x20);
            }
          }
          piVar19 = piVar19 + 1;
          iVar18 = iVar18 + -1;
          pfVar17 = pfVar17 + 0xe;
        } while (1 < iVar18);
      }
      local_b4 = local_b4 + iVar3;
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->thedim);
  }
  return local_b4;
}

Assistant:

int CLUFactor<R>::setupColVals()
{
   int i;
   int n = thedim;

   if(!u.col.val.empty())
      u.col.val.clear();

   u.col.val.reserve(u.col.size); // small performance improvement before the insertion
   u.col.val.insert(u.col.val.begin(), u.col.size, 0);

   for(i = 0; i < thedim; i++)
      u.col.len[i] = 0;

   maxabs = R(0.0);

   for(i = 0; i < thedim; i++)
   {
      int     k   = u.row.start[i];
      int*    idx = &u.row.idx[k];
      R*   val = &u.row.val[k];
      int     len = u.row.len[i];

      n += len;

      while(len-- > 0)
      {
         assert((*idx >= 0) && (*idx < thedim));

         k = u.col.start[*idx] + u.col.len[*idx];

         assert((k >= 0) && (k < u.col.size));

         u.col.len[*idx]++;

         assert(u.col.len[*idx] <= u.col.max[*idx]);

         u.col.idx[k] = i;
         u.col.val[k] = *val;

         if(spxAbs(*val) > maxabs)
            maxabs = spxAbs(*val);

         idx++;

         val++;
      }
   }

   return n;
}